

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.cpp
# Opt level: O1

void __thiscall FileManager::closeFile(FileManager *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  peVar1 = (this->activeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    Logger::queueError<>(Warning,"No file opened");
    return;
  }
  (*peVar1->_vptr_AssemblerFile[3])();
  this_00 = (this->activeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->activeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->activeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

void FileManager::closeFile()
{
	if (activeFile == nullptr)
	{
		Logger::queueError(Logger::Warning, "No file opened");
		return;
	}

	activeFile->close();
	activeFile = nullptr;
}